

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# footprinttocsv.cpp
# Opt level: O1

void footprinttocsv::doit
               (bool skipheader,int from_event,int to_event,char *binFileName,char *idxFileName)

{
  pointer puVar1;
  pointer puVar2;
  FILE *__stream;
  FILE *__stream_00;
  size_t sVar3;
  char *pcVar4;
  undefined7 in_register_00000039;
  pointer puVar5;
  EventIndex idx;
  int local_44;
  long local_40;
  longlong local_38;
  
  if ((int)CONCAT71(in_register_00000039,skipheader) == 0) {
    puts("event_id, areaperil_id, intensity_bin_id, probability");
  }
  __stream = fopen(binFileName,"rb");
  pcVar4 = "rb";
  __stream_00 = fopen(idxFileName,"rb");
  if (__stream_00 != (FILE *)0x0) {
    sVar3 = fread(&local_44,0x14,1,__stream_00);
    if (sVar3 != 0) {
      do {
        if ((to_event == 0 && from_event == 0) || (local_44 <= to_event && from_event <= local_44))
        {
          fseek(__stream,local_40,0);
          printrows(local_44,(FILE *)__stream,local_38);
        }
        sVar3 = fread(&local_44,0x14,1,__stream_00);
      } while (sVar3 != 0);
    }
    fclose(__stream);
    fclose(__stream_00);
    return;
  }
  doit();
  puVar1 = (((vector<unsigned_char,_std::allocator<unsigned_char>_> *)idxFileName)->
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (((vector<unsigned_char,_std::allocator<unsigned_char>_> *)idxFileName)->
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  puVar5 = puVar2 + -(long)puVar1;
  if (pcVar4 >= puVar5 && (long)pcVar4 - (long)puVar5 != 0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_default_append
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)idxFileName,
               (long)pcVar4 - (long)puVar5);
    return;
  }
  if ((pcVar4 < puVar5) && (puVar2 != (pointer)pcVar4 + (long)puVar1)) {
    (((vector<unsigned_char,_std::allocator<unsigned_char>_> *)idxFileName)->
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)pcVar4 + (long)puVar1;
  }
  return;
}

Assistant:

void doit(bool skipheader, int from_event, int to_event, const char * binFileName="footprint.bin", const char * idxFileName="footprint.idx")
	{
		if (skipheader == false)  printf("event_id, areaperil_id, intensity_bin_id, probability\n");
		bool no_event_range = ( (from_event == to_event) && (from_event == 0) );
		FILE *finx = fopen(binFileName, "rb");
		FILE *finy = fopen(idxFileName, "rb");

		EventIndex idx;

		if (finy == nullptr) {
			fprintf(stderr, "FATAL: Footprint idx open failed\n");
			exit(3);
		}
		size_t i = fread(&idx, sizeof(idx), 1, finy);
		while (i != 0) {
			if ((no_event_range) ||
			    (idx.event_id >= from_event && idx.event_id <= to_event)) {
				flseek(finx, idx.offset, SEEK_SET);
				printrows(idx.event_id, finx, idx.size);
			}
			i = fread(&idx, sizeof(idx), 1, finy);
		}

		fclose(finx);
		fclose(finy);
	}